

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImRect IVar5;
  
  switch(rect_type) {
  case 0:
    IVar2 = window->Pos;
    IVar1 = window->Size;
    goto LAB_00164b26;
  case 1:
    return window->OuterRectClipped;
  case 2:
    return window->InnerRect;
  case 3:
    return window->InnerClipRect;
  case 4:
    return window->WorkRect;
  case 5:
    IVar1 = window->ContentSize;
    break;
  case 6:
    IVar1 = window->ContentSizeIdeal;
    break;
  case 7:
    return window->ContentRegionRect;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2a32,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  auVar3._8_8_ = 0;
  auVar3._0_4_ = (window->Scroll).x;
  auVar3._4_4_ = (window->Scroll).y;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = (window->InnerRect).Min.x;
  auVar4._4_4_ = (window->InnerRect).Min.y;
  auVar3 = vsubps_avx(auVar4,auVar3);
  IVar2.x = auVar3._0_4_ + (window->WindowPadding).x;
  IVar2.y = auVar3._4_4_ + (window->WindowPadding).y;
LAB_00164b26:
  IVar5.Max.x = IVar2.x + IVar1.x;
  IVar5.Max.y = IVar2.y + IVar1.y;
  IVar5.Min = IVar2;
  return IVar5;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }